

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshComputeChow(word *t,int nVars,int *pChow)

{
  int iVar1;
  int local_2c;
  int nMints;
  int Chow0;
  int k;
  int i;
  int *pChow_local;
  int nVars_local;
  word *t_local;
  
  local_2c = 0;
  memset(pChow,0,(long)nVars << 2);
  for (Chow0 = 0; Chow0 < 1 << ((byte)nVars & 0x1f); Chow0 = Chow0 + 1) {
    iVar1 = Abc_TtGetBit(t,Chow0);
    if (iVar1 != 0) {
      local_2c = local_2c + 1;
      for (nMints = 0; nMints < nVars; nMints = nMints + 1) {
        if ((Chow0 >> ((byte)nMints & 0x1f) & 1U) != 0) {
          pChow[nMints] = pChow[nMints] + 1;
        }
      }
    }
  }
  for (nMints = 0; nMints < nVars; nMints = nMints + 1) {
    pChow[nMints] = pChow[nMints] * 2 - local_2c;
  }
  return local_2c - (1 << ((byte)nVars - 1 & 0x1f));
}

Assistant:

int Extra_ThreshComputeChow(word * t, int nVars, int * pChow) {
    int i, k, Chow0 = 0, nMints = (1 << nVars);
    memset(pChow, 0, sizeof(int) * nVars);
    // compute Chow coefs
    for (i = 0; i < nMints; i++)
        if (Abc_TtGetBit(t, i))
            for (Chow0++, k = 0; k < nVars; k++)
                if ((i >> k) & 1)
                    pChow[k]++;
    // compute modified Chow coefs
    for (k = 0; k < nVars; k++)
        pChow[k] = 2 * pChow[k] - Chow0;
    return Chow0 - (1 << (nVars - 1));
}